

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::half>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *result)

{
  pointer phVar1;
  iterator iVar2;
  StreamReader *pSVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  half value;
  half value_1;
  half local_52;
  string local_50;
  
  phVar1 = (result->
           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
      _M_impl.super__Vector_impl_data._M_finish != phVar1) {
    (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
    _M_impl.super__Vector_impl_data._M_finish = phVar1;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ReadBasicType(this,&local_52);
    if (bVar4) {
      iVar2._M_current =
           (result->
           super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>::
        _M_realloc_insert<tinyusdz::value::half_const&>
                  ((vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>> *)result,
                   iVar2,&local_52);
      }
      else {
        (iVar2._M_current)->value = local_52.value;
        (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_00378102;
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_52);
        if (!bVar4) {
          return false;
        }
        if ((char)local_52.value == sep) {
          bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = LookChar1(this,(char *)&local_50);
          if (!bVar4) {
            return false;
          }
          iVar5 = 3;
          if ((char)local_50._M_dataplus._M_p != end_symbol) {
            goto LAB_0037807f;
          }
        }
        else {
LAB_0037807f:
          if ((char)local_52.value != sep) {
            pSVar3 = this->_sr;
            if ((0 < (long)pSVar3->idx_) && (uVar6 = pSVar3->idx_ - 1, uVar6 <= pSVar3->length_)) {
              pSVar3->idx_ = uVar6;
            }
            goto LAB_00378102;
          }
          bVar4 = SkipWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = ReadBasicType(this,(half *)&local_50);
          iVar5 = 3;
          if (bVar4) {
            iVar2._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>::
              _M_realloc_insert<tinyusdz::value::half_const&>
                        ((vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>> *)
                         result,iVar2,(half *)&local_50);
            }
            else {
              (iVar2._M_current)->value = (uint16_t)local_50._M_dataplus._M_p;
              (result->
              super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
              _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar5 = 0;
          }
        }
      } while (iVar5 == 0);
      if (iVar5 == 1) {
        return false;
      }
LAB_00378102:
      if ((result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (result->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar8 = "Empty array.\n";
      pcVar7 = "";
    }
    else {
      pcVar8 = "Not starting with the value of requested type.\n";
      pcVar7 = "";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar8,pcVar7);
    PushError(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}